

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

__m256i * highbd_comp_mask_pred_line_avx2(__m256i s0,__m256i s1,__m256i a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_YMM1_H;
  undefined8 in_register_00001258;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  undefined8 in_YMM2_H;
  undefined8 in_register_00001298;
  __m256i comp;
  __m256i pred_h;
  __m256i pred_hi;
  __m256i a_hi;
  __m256i s_hi;
  __m256i pred_l;
  __m256i pred_lo;
  __m256i a_lo;
  __m256i s_lo;
  __m256i a_inv;
  __m256i round_const;
  __m256i alpha_max;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar2 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar2 = vpinsrw_avx(auVar2,0x40,2);
  auVar2 = vpinsrw_avx(auVar2,0x40,3);
  auVar2 = vpinsrw_avx(auVar2,0x40,4);
  auVar2 = vpinsrw_avx(auVar2,0x40,5);
  auVar2 = vpinsrw_avx(auVar2,0x40,6);
  auVar3 = vpinsrw_avx(auVar2,0x40,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar2 = vpinsrw_avx(auVar2,0x40,2);
  auVar2 = vpinsrw_avx(auVar2,0x40,3);
  auVar2 = vpinsrw_avx(auVar2,0x40,4);
  auVar2 = vpinsrw_avx(auVar2,0x40,5);
  auVar2 = vpinsrw_avx(auVar2,0x40,6);
  auVar2 = vpinsrw_avx(auVar2,0x40,7);
  uStack_2d0 = auVar2._0_8_;
  uStack_2c8 = auVar2._8_8_;
  auVar2 = vpinsrd_avx(ZEXT416(0x20),0x20,1);
  auVar2 = vpinsrd_avx(auVar2,0x20,2);
  auVar2 = vpinsrd_avx(auVar2,0x20,3);
  auVar1 = vpinsrd_avx(ZEXT416(0x20),0x20,1);
  auVar1 = vpinsrd_avx(auVar1,0x20,2);
  auVar1 = vpinsrd_avx(auVar1,0x20,3);
  uStack_70 = auVar1._0_8_;
  uStack_68 = auVar1._8_8_;
  auVar7._16_8_ = uStack_2d0;
  auVar7._0_16_ = auVar3;
  auVar7._24_8_ = uStack_2c8;
  auVar5._8_8_ = in_XMM2_Qb;
  auVar5._0_8_ = in_XMM2_Qa;
  auVar5._16_8_ = in_YMM2_H;
  auVar5._24_8_ = in_register_00001298;
  auVar4 = vpsubw_avx2(auVar7,auVar5);
  auVar10._8_8_ = in_XMM0_Qb;
  auVar10._0_8_ = in_XMM0_Qa;
  auVar10._16_8_ = in_YMM0_H;
  auVar10._24_8_ = in_register_00001218;
  auVar9._8_8_ = in_XMM1_Qb;
  auVar9._0_8_ = in_XMM1_Qa;
  auVar9._16_8_ = in_YMM1_H;
  auVar9._24_8_ = in_register_00001258;
  auVar5 = vpunpcklwd_avx2(auVar10,auVar9);
  auVar8._8_8_ = in_XMM2_Qb;
  auVar8._0_8_ = in_XMM2_Qa;
  auVar8._16_8_ = in_YMM2_H;
  auVar8._24_8_ = in_register_00001298;
  auVar6 = vpunpcklwd_avx2(auVar8,auVar4);
  auVar5 = vpmaddwd_avx2(auVar5,auVar6);
  auVar6._16_8_ = uStack_70;
  auVar6._0_16_ = auVar2;
  auVar6._24_8_ = uStack_68;
  auVar5 = vpaddd_avx2(auVar5,auVar6);
  auVar6 = vpsrad_avx2(auVar5,ZEXT416(6));
  auVar13._8_8_ = in_XMM0_Qb;
  auVar13._0_8_ = in_XMM0_Qa;
  auVar13._16_8_ = in_YMM0_H;
  auVar13._24_8_ = in_register_00001218;
  auVar12._8_8_ = in_XMM1_Qb;
  auVar12._0_8_ = in_XMM1_Qa;
  auVar12._16_8_ = in_YMM1_H;
  auVar12._24_8_ = in_register_00001258;
  auVar5 = vpunpckhwd_avx2(auVar13,auVar12);
  auVar11._8_8_ = in_XMM2_Qb;
  auVar11._0_8_ = in_XMM2_Qa;
  auVar11._16_8_ = in_YMM2_H;
  auVar11._24_8_ = in_register_00001298;
  auVar4 = vpunpckhwd_avx2(auVar11,auVar4);
  auVar5 = vpmaddwd_avx2(auVar5,auVar4);
  auVar4._16_8_ = uStack_70;
  auVar4._0_16_ = auVar2;
  auVar4._24_8_ = uStack_68;
  auVar5 = vpaddd_avx2(auVar5,auVar4);
  auVar5 = vpsrad_avx2(auVar5,ZEXT416(6));
  vpackssdw_avx2(auVar6,auVar5);
  return (__m256i *)0x6;
}

Assistant:

static inline __m256i highbd_comp_mask_pred_line_avx2(const __m256i s0,
                                                      const __m256i s1,
                                                      const __m256i a) {
  const __m256i alpha_max = _mm256_set1_epi16((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m256i round_const =
      _mm256_set1_epi32((1 << AOM_BLEND_A64_ROUND_BITS) >> 1);
  const __m256i a_inv = _mm256_sub_epi16(alpha_max, a);

  const __m256i s_lo = _mm256_unpacklo_epi16(s0, s1);
  const __m256i a_lo = _mm256_unpacklo_epi16(a, a_inv);
  const __m256i pred_lo = _mm256_madd_epi16(s_lo, a_lo);
  const __m256i pred_l = _mm256_srai_epi32(
      _mm256_add_epi32(pred_lo, round_const), AOM_BLEND_A64_ROUND_BITS);

  const __m256i s_hi = _mm256_unpackhi_epi16(s0, s1);
  const __m256i a_hi = _mm256_unpackhi_epi16(a, a_inv);
  const __m256i pred_hi = _mm256_madd_epi16(s_hi, a_hi);
  const __m256i pred_h = _mm256_srai_epi32(
      _mm256_add_epi32(pred_hi, round_const), AOM_BLEND_A64_ROUND_BITS);

  const __m256i comp = _mm256_packs_epi32(pred_l, pred_h);

  return comp;
}